

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* util::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *__return_storage_ptr__,string *str,char delim,bool skip_empty)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  ulong uVar4;
  undefined1 local_1d8 [8];
  string s;
  stringstream local_1a8 [8];
  stringstream ss;
  bool skip_empty_local;
  char delim_local;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *items;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a8,(string *)str,_Var2);
  std::__cxx11::string::string((string *)local_1d8);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,(string *)local_1d8,delim);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    if ((!skip_empty) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
    }
  }
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> split(const std::string& str, char delim, bool skip_empty)
{
    std::vector<std::string> items;
    std::stringstream ss(str);
    std::string s;

    while (std::getline(ss, s, delim))
    {
        if (!skip_empty || !s.empty())
            items.emplace_back(std::move(s));
    }

    return items;
}